

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simdfastpfor.h
# Opt level: O0

uint32_t * __thiscall
FastPForLib::SIMDSimplePFor<FastPForLib::Simple8b<true>_>::decodeArray
          (SIMDSimplePFor<FastPForLib::Simple8b<true>_> *this,uint32_t *in,size_t length,
          uint32_t *out,size_t *nvalue)

{
  NotEnoughStorage *this_00;
  ulong uVar1;
  ulong uVar2;
  ulong in_RCX;
  long in_RDX;
  uint *in_RSI;
  long in_RDI;
  ulong *in_R8;
  size_t in_stack_00000010;
  size_t thissize;
  size_t thisnvalue;
  uint32_t *finalout;
  SIMDSimplePFor<FastPForLib::Simple8b<true>_> *in_stack_00000030;
  size_t mynvalue;
  uint32_t *initin;
  size_t in_stack_ffffffffffffff88;
  ulong local_20;
  uint *local_10;
  
  local_10 = in_RSI + 1;
  if (*in_R8 < (ulong)*in_RSI) {
    this_00 = (NotEnoughStorage *)__cxa_allocate_exception(0x18);
    NotEnoughStorage::NotEnoughStorage(this_00,in_stack_ffffffffffffff88);
    __cxa_throw(this_00,&NotEnoughStorage::typeinfo,NotEnoughStorage::~NotEnoughStorage);
  }
  *in_R8 = (ulong)*in_RSI;
  uVar1 = in_RCX + *in_R8 * 4;
  for (local_20 = in_RCX; local_20 != uVar1; local_20 = uVar2 * 4 + local_20) {
    if (local_20 + (ulong)*(uint *)(in_RDI + 0x10) * 4 < uVar1) {
      uVar2 = (ulong)*(uint *)(in_RDI + 0x10);
    }
    else {
      uVar2 = (long)(uVar1 - local_20) >> 2;
    }
    __decodeArray(in_stack_00000030,finalout,(size_t *)thisnvalue,(uint32_t *)thissize,
                  in_stack_00000010);
    local_10 = local_10 + (in_RDX - ((long)local_10 - (long)in_RSI >> 2));
  }
  return local_10;
}

Assistant:

const uint32_t *decodeArray(const uint32_t *in, const size_t length,
                              uint32_t *out, size_t &nvalue) override {
    const uint32_t *const initin(in);
    const size_t mynvalue = *in;
    ++in;
    if (mynvalue > nvalue)
      throw NotEnoughStorage(mynvalue);
    nvalue = mynvalue;
    const uint32_t *const finalout(out + nvalue);
    while (out != finalout) {
      size_t thisnvalue = length - (in - initin);
      size_t thissize = static_cast<size_t>(
          finalout > PageSize + out ? PageSize : (finalout - out));

      __decodeArray(in, thisnvalue, out, thissize);
      in += thisnvalue;
      out += thissize;
    }
    assert(initin + length >= in);
    return in;
  }